

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O0

void __thiscall trimesh::mscomplex_t::cancel_pair(mscomplex_t *this,int p,int q)

{
  int iVar1;
  size_type sVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  char *pcVar5;
  char *pcVar6;
  reference pvVar7;
  reference pvVar8;
  size_type sVar9;
  size_type sVar10;
  int __c;
  int __c_00;
  pair<int,_int> local_8a4;
  undefined1 local_899;
  string local_898 [32];
  stringstream local_878 [8];
  stringstream ss_4;
  ostream local_868 [376];
  uint local_6f0;
  undefined1 local_6e9;
  string local_6e8 [32];
  stringstream local_6c8 [8];
  stringstream ss_3;
  ostream local_6b8 [380];
  uint local_53c;
  uint local_538;
  undefined1 local_531;
  string local_530 [32];
  stringstream local_510 [8];
  stringstream ss_2;
  ostream local_500 [383];
  undefined1 local_381;
  string local_380 [32];
  stringstream local_360 [8];
  stringstream ss_1;
  ostream local_350 [383];
  undefined1 local_1d1;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  uint local_18;
  uint local_14;
  int q_local;
  int p_local;
  mscomplex_t *this_local;
  
  local_18 = q;
  local_14 = p;
  _q_local = this;
  order_pr_by_cp_index(this,(int *)&local_14,(int *)&local_18);
  iVar1 = this->m_multires_version;
  sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    (&this->m_canc_list);
  if ((long)iVar1 != sVar2) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar3 = std::operator<<(local_190,"Failed to ensure condition ");
    poVar3 = std::operator<<(poVar3,"m_multires_version == m_canc_list.size()");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"at (");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = std::operator<<(poVar3,"cancel_pair");
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x137);
    poVar3 = std::operator<<(poVar3,") \n ");
    poVar3 = std::operator<<(poVar3,"Message : ");
    poVar3 = std::operator<<(poVar3,
                             "\"Cannot cancel pair !! Ms complex resolution is not coarsest.\"");
    std::operator<<(poVar3,"\n");
    local_1d1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1d0);
    local_1d1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar5 = index(this,(char *)(ulong)local_14,__c);
  pcVar6 = index(this,(char *)(ulong)local_18,__c_00);
  if ((int)pcVar5 != (int)pcVar6 + 1) {
    std::__cxx11::stringstream::stringstream(local_360);
    poVar3 = std::operator<<(local_350,"Failed to ensure condition ");
    poVar3 = std::operator<<(poVar3,"index(p) == index(q)+1");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"at (");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                            );
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = std::operator<<(poVar3,"cancel_pair");
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x139);
    poVar3 = std::operator<<(poVar3,") \n ");
    poVar3 = std::operator<<(poVar3,"Message : ");
    poVar3 = std::operator<<(poVar3,"\"indices do not differ by 1\"");
    std::operator<<(poVar3,"\n");
    local_381 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar4,local_380);
    local_381 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->m_cp_pair_idx,(long)(int)local_14);
  if (*pvVar7 == -1) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->m_cp_pair_idx,(long)(int)local_18);
    if (*pvVar7 == -1) {
      pvVar8 = std::
               vector<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               ::operator[](this->m_des_conn,(long)(int)local_14);
      local_538 = local_18;
      sVar9 = std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
              count(pvVar8,&local_538);
      pvVar8 = std::
               vector<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               ::operator[](this->m_asc_conn,(long)(int)local_18);
      local_53c = local_14;
      sVar10 = std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
               count(pvVar8,&local_53c);
      if (sVar9 != sVar10) {
        std::__cxx11::stringstream::stringstream(local_6c8);
        poVar3 = std::operator<<(local_6b8,"Failed to ensure condition ");
        poVar3 = std::operator<<(poVar3,"m_des_conn[p].count(q) == m_asc_conn[q].count(p)");
        poVar3 = std::operator<<(poVar3,"\n");
        poVar3 = std::operator<<(poVar3,"at (");
        poVar3 = std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                                );
        poVar3 = std::operator<<(poVar3,",");
        poVar3 = std::operator<<(poVar3,"cancel_pair");
        poVar3 = std::operator<<(poVar3,",");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x13d);
        poVar3 = std::operator<<(poVar3,") \n ");
        poVar3 = std::operator<<(poVar3,"Message : ");
        poVar3 = std::operator<<(poVar3,"\"p is not connected to q\"");
        std::operator<<(poVar3,"\n");
        local_6e9 = 1;
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::runtime_error::runtime_error(prVar4,local_6e8);
        local_6e9 = 0;
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar8 = std::
               vector<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               ::operator[](this->m_des_conn,(long)(int)local_14);
      local_6f0 = local_18;
      sVar9 = std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
              count(pvVar8,&local_6f0);
      if (sVar9 == 1) {
        sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                          (&this->m_canc_list);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->m_cp_cancno,(long)(int)local_14);
        *pvVar7 = (value_type)sVar2;
        sVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                          (&this->m_canc_list);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->m_cp_cancno,(long)(int)local_18);
        *pvVar7 = (value_type)sVar2;
        local_8a4 = std::make_pair<int&,int&>((int *)&local_14,(int *)&local_18);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  (&this->m_canc_list,&local_8a4);
        cancel_pair(this);
        return;
      }
      std::__cxx11::stringstream::stringstream(local_878);
      poVar3 = std::operator<<(local_868,"Failed to ensure condition ");
      poVar3 = std::operator<<(poVar3,"m_des_conn[p].count(q) == 1");
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"at (");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                              );
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = std::operator<<(poVar3,"cancel_pair");
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x13f);
      poVar3 = std::operator<<(poVar3,") \n ");
      poVar3 = std::operator<<(poVar3,"Message : ");
      poVar3 = std::operator<<(poVar3,"\"p and q are multiply connected\"");
      std::operator<<(poVar3,"\n");
      local_899 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::runtime_error::runtime_error(prVar4,local_898);
      local_899 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::stringstream::stringstream(local_510);
  poVar3 = std::operator<<(local_500,"Failed to ensure condition ");
  poVar3 = std::operator<<(poVar3,"m_cp_pair_idx[p] == -1 && m_cp_pair_idx[q] == -1");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"at (");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                          );
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = std::operator<<(poVar3,"cancel_pair");
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x13b);
  poVar3 = std::operator<<(poVar3,") \n ");
  poVar3 = std::operator<<(poVar3,"Message : ");
  poVar3 = std::operator<<(poVar3,"\"p/q has already been paired\"");
  std::operator<<(poVar3,"\n");
  local_531 = 1;
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(prVar4,local_530);
  local_531 = 0;
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void mscomplex_t::cancel_pair ( int p, int q)
{
  order_pr_by_cp_index(*this,p,q);

  ENSURE(m_multires_version == m_canc_list.size(),
         "Cannot cancel pair !! Ms complex resolution is not coarsest.");
  ENSURE(index(p) == index(q)+1,
         "indices do not differ by 1");
  ENSURE(m_cp_pair_idx[p] == -1 && m_cp_pair_idx[q] == -1,
         "p/q has already been paired");
  ENSURE(m_des_conn[p].count(q)  == m_asc_conn[q].count(p),
         "p is not connected to q");
  ENSURE(m_des_conn[p].count(q) == 1,
         "p and q are multiply connected");

  m_cp_cancno[p] = m_canc_list.size();
  m_cp_cancno[q] = m_canc_list.size();
  m_canc_list.push_back(make_pair(p,q));

  cancel_pair();
}